

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O2

void __thiscall
iu_DISABLED_FooP_x_iutest_x_Bar_Test::Body(iu_DISABLED_FooP_x_iutest_x_Bar_Test *this)

{
  int val;
  ParamType *pPVar1;
  Fixed *fixed;
  iuCodeMessage iStack_1c8;
  Fixed local_198;
  
  pPVar1 = iutest::WithParamInterface<int>::GetParam();
  val = *pPVar1;
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_198,val);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&iStack_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/disabled_tests_decl.cpp"
             ,0x3e,"Failed.\n");
  iStack_1c8._44_4_ = 2;
  iutest::AssertionHelper::operator=((AssertionHelper *)&iStack_1c8,fixed);
  std::__cxx11::string::~string((string *)&iStack_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
  return;
}

Assistant:

IUTEST_P(DISABLED_FooP, Bar)
{
    int v = GetParam();
    IUTEST_FAIL() << v;
}